

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_details.cxx
# Opt level: O1

void __thiscall xray_re::details_header::save(details_header *this,xr_writer *w)

{
  uint32_t local_1c;
  
  local_1c = this->version;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->object_count;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->offs_x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->offs_z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->size_x;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  local_1c = this->size_z;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void details_header::save(xr_writer& w) const
{
	w.w_u32(version);
	w.w_u32(object_count);
	w.w_s32(offs_x);
	w.w_s32(offs_z);
	w.w_u32(size_x);
	w.w_u32(size_z);
}